

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O3

Result __thiscall
Inferences::SimplifyingGeneratingLiteralSimplification::simplify
          (SimplifyingGeneratingLiteralSimplification *this,Clause *cl_,bool doOrderingCheck)

{
  Literal *pLVar1;
  Literal *pLVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 extraout_DL;
  undefined7 in_register_00000011;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  Result RVar7;
  undefined4 local_a4;
  Stack<Kernel::Literal_*> local_a0;
  undefined4 local_7c;
  undefined8 local_78;
  SimplifyingInference1 local_70;
  Inference local_60;
  
  local_7c = (undefined4)CONCAT71(in_register_00000011,doOrderingCheck);
  uVar5 = *(ulong *)&cl_->field_0x38 & 0xfffff;
  local_a0._capacity = uVar5;
  if (uVar5 == 0) {
    local_a0._stack = (Literal **)0x0;
    local_a0._cursor = (Literal **)0x0;
    local_a0._end = (Literal **)0x0;
  }
  else {
    uVar4 = (int)uVar5 * 8 + 0xfU & 0xfffffff0;
    if (uVar4 == 0) {
      local_a0._stack =
           (Literal **)
           Lib::FixedSizeAllocator<8UL>::alloc
                     ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar4 < 0x11) {
      local_a0._stack =
           (Literal **)
           Lib::FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar4 < 0x19) {
      local_a0._stack =
           (Literal **)
           Lib::FixedSizeAllocator<24UL>::alloc
                     ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar4 < 0x21) {
      local_a0._stack =
           (Literal **)
           Lib::FixedSizeAllocator<32UL>::alloc
                     ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar4 < 0x31) {
      local_a0._stack =
           (Literal **)
           Lib::FixedSizeAllocator<48UL>::alloc
                     ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar4 < 0x41) {
      local_a0._stack =
           (Literal **)
           Lib::FixedSizeAllocator<64UL>::alloc
                     ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      local_a0._stack = (Literal **)::operator_new((ulong)uVar4,0x10);
    }
    local_a0._end = local_a0._stack + uVar5;
    local_a0._cursor = local_a0._stack;
    if ((*(ulong *)&cl_->field_0x38 & 0xfffff) != 0) {
      local_a4 = (undefined4)CONCAT71((int7)((ulong)local_a0._end >> 8),1);
      uVar5 = 0;
      uVar6 = 0;
      local_78 = 0;
      do {
        pLVar1 = cl_->_literals[uVar5];
        uVar4 = (*(this->super_SimplifyingGeneratingInference1).super_SimplifyingGeneratingInference
                  .super_InferenceEngine._vptr_InferenceEngine[8])(this,pLVar1);
        local_70.rule = (InferenceRule)uVar4;
        local_70._1_7_ = SUB87(CONCAT44(extraout_var,uVar4) >> 8,0);
        pLVar2 = (Literal *)CONCAT17(extraout_DL,local_70._1_7_);
        local_70.premise._0_1_ = extraout_DL;
        if (pLVar2 == pLVar1 && (uVar4 & 1) == 0) {
          if (local_a0._cursor == local_a0._end) {
            Lib::Stack<Kernel::Literal_*>::expand(&local_a0);
          }
          *local_a0._cursor = pLVar1;
          local_a0._cursor = local_a0._cursor + 1;
        }
        else {
          *(int *)(DAT_00b521c0 + 400) = *(int *)(DAT_00b521c0 + 400) + 1;
          if ((uVar4 & 1) == 0) {
            if (local_a0._cursor == local_a0._end) {
              Lib::Stack<Kernel::Literal_*>::expand(&local_a0);
            }
            *local_a0._cursor = pLVar2;
            local_a0._cursor = local_a0._cursor + 1;
            if ((char)local_7c != '\0') {
              iVar3 = (*this->_ordering->_vptr_Ordering[2])(this->_ordering,pLVar2,pLVar1);
              if (iVar3 == 1) {
                *(int *)(DAT_00b521c0 + 0x18c) = *(int *)(DAT_00b521c0 + 0x18c) + 1;
LAB_004ebf59:
                local_a4 = 0;
              }
              else if (iVar3 == 2) {
                local_78 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar3) >> 8),1);
              }
              else if (iVar3 == 4) {
                *(int *)(DAT_00b521c0 + 0x188) = *(int *)(DAT_00b521c0 + 0x188) + 1;
                goto LAB_004ebf59;
              }
            }
            uVar6 = 1;
          }
          else {
            uVar6 = 1;
            if ((uVar4 & 0x100) != 0) {
              cl_ = (Clause *)0x0;
              goto LAB_004ebfbc;
            }
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < ((uint)*(undefined8 *)&cl_->field_0x38 & 0xfffff));
      if (uVar6 != 0) {
        local_70.rule = this->_rule;
        local_70.premise._0_1_ = SUB81(cl_,0);
        local_70.premise._1_7_ = (undefined7)((ulong)cl_ >> 8);
        Kernel::Inference::Inference(&local_60,&local_70);
        cl_ = Kernel::Clause::fromStack(&local_a0,&local_60);
        uVar6 = (ulong)CONCAT31((int3)((uint)local_a4 >> 8),(byte)local_a4 & (byte)local_78);
        goto LAB_004ebfbc;
      }
    }
  }
  uVar6 = 0;
LAB_004ebfbc:
  if (local_a0._stack != (Literal **)0x0) {
    uVar5 = local_a0._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar5 == 0) {
      *local_a0._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_a0._stack;
    }
    else if (uVar5 < 0x11) {
      *local_a0._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_a0._stack;
    }
    else if (uVar5 < 0x19) {
      *local_a0._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_a0._stack;
    }
    else if (uVar5 < 0x21) {
      *local_a0._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_a0._stack;
    }
    else if (uVar5 < 0x31) {
      *local_a0._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_a0._stack;
    }
    else if (uVar5 < 0x41) {
      *local_a0._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_a0._stack;
    }
    else {
      operator_delete(local_a0._stack,0x10);
    }
  }
  RVar7._8_8_ = uVar6;
  RVar7.simplified = cl_;
  return RVar7;
}

Assistant:

SimplifyingGeneratingInference1::Result SimplifyingGeneratingLiteralSimplification::simplify(Clause* cl_, bool doOrderingCheck) {
  DEBUG("in:  ", *cl_)
  auto& cl = *cl_;
  Stack<Literal*> out(cl.size());

  bool changed = false;
  bool allLessEq = true;
  bool oneLess = false;

  for (unsigned i = 0; i < cl.size(); i++) {

    auto orig = cl[i];
    auto result = simplifyLiteral(orig);

    if (result.isLiteral() && result.unwrapLiteral() == orig ) {
      out.push(orig);
    } else {
      auto simpl = result;
      env.statistics->evaluationCnt++;

      if (simpl.isConstant()) {

        bool trivialValue = simpl.unwrapConstant();
        if (trivialValue) {
          /* clause is a tautology and can be deleted */
          return SimplifyingGeneratingInference1::Result::tautology();
        } else {
          /* do not add the literal to the output stack */
          changed = true;
        }

      } else {

        Literal* simplLit = simpl.unwrapLiteral();
        ASS_NEQ(simplLit, orig)
        changed = true;
        out.push(simplLit);

        if (doOrderingCheck) {
          ASS(_ordering)
          auto cmp = _ordering->compare(simplLit, orig);
          switch(cmp) {
            case Ordering::Result::LESS:
              oneLess = true;
              break;
            case Ordering::Result::EQUAL:
              ASSERTION_VIOLATION
              break;
            case Ordering::Result::INCOMPARABLE:
            case Ordering::Result::GREATER:
              if (cmp == Ordering::Result::INCOMPARABLE) {
                env.statistics->evaluationIncomp++;
              } else {
                env.statistics->evaluationGreater++;
              }
              DEBUG("ordering violated: ", cmp)
              DEBUG("orig: ", *orig)
              DEBUG("simp: ", *simplLit)
              allLessEq = false;
              break;
          }
        }
      }
    }
  }


  if (!changed) {
    return SimplifyingGeneratingInference1::Result::nop(cl_);
  } else {
    auto result = Clause::fromStack(out, SimplifyingInference1(_rule, cl_));
    DEBUG("out: ", *result)
    return SimplifyingGeneratingInference1::Result{
            .simplified = result, 
            .premiseRedundant = allLessEq && oneLess,
          };
  }
}